

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O0

void __thiscall TApp_CheckName_Test::TestBody(TApp_CheckName_Test *this)

{
  bool bVar1;
  Option *pOVar2;
  Option *pOVar3;
  char *pcVar4;
  char *in_R9;
  string local_778;
  AssertHelper local_758;
  Message local_750;
  allocator local_741;
  string local_740;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_6e8;
  Message local_6e0;
  allocator local_6d1;
  string local_6d0;
  bool local_6a9;
  undefined1 local_6a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_678;
  Message local_670;
  allocator local_661;
  string local_660;
  bool local_639;
  undefined1 local_638 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_608;
  Message local_600;
  allocator local_5f1;
  string local_5f0;
  bool local_5c9;
  undefined1 local_5c8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_598;
  Message local_590;
  allocator local_581;
  string local_580;
  bool local_559;
  undefined1 local_558 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_528;
  Message local_520;
  allocator local_511;
  string local_510;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_4b8;
  Message local_4b0;
  allocator local_4a1;
  string local_4a0;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_448;
  Message local_440;
  allocator local_431;
  string local_430;
  bool local_409;
  undefined1 local_408 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3d8;
  Message local_3d0;
  allocator local_3c1;
  string local_3c0;
  bool local_399;
  undefined1 local_398 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_368;
  Message local_360;
  allocator local_351;
  string local_350;
  bool local_329;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_2f8;
  Message local_2f0;
  allocator local_2e1;
  string local_2e0;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_288;
  Message local_280;
  allocator local_271;
  string local_270;
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_;
  string local_230;
  allocator local_209;
  string local_208;
  Option *local_1e8;
  Option *pos2;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  Option *local_190;
  Option *pos1;
  int local_180;
  int y;
  int x;
  allocator local_151;
  string local_150;
  Option *local_130;
  Option *short2;
  string local_120;
  allocator local_f9;
  string local_f8;
  Option *local_d8;
  Option *short1;
  string local_c8;
  allocator local_a1;
  string local_a0;
  Option *local_80;
  Option *long2;
  string local_70;
  allocator local_39;
  string local_38;
  Option *local_18;
  Option *long1;
  TApp_CheckName_Test *this_local;
  
  long1 = (Option *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"--long1",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"",(allocator *)((long)&long2 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&long2 + 7));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"--Long2",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"",(allocator *)((long)&short1 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&short1 + 7));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,"-a",&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_120,"",(allocator *)((long)&short2 + 7));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_f8,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&short2 + 7));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_d8 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"-B",&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&x,"",(allocator *)((long)&y + 3));
  pOVar2 = CLI::App::add_flag(&(this->super_TApp).app,&local_150,(string *)&x);
  std::__cxx11::string::~string((string *)&x);
  std::allocator<char>::~allocator((allocator<char> *)((long)&y + 3));
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_130 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"pos1",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"",(allocator *)((long)&pos2 + 7));
  pOVar2 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_1b0,&local_180,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos2 + 7));
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  local_190 = pOVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"pOs2",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_230,"",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  pOVar3 = CLI::App::add_option<int,_(CLI::detail::enabler)0>
                     (&(this->super_TApp).app,&local_208,(int *)((long)&pos1 + 4),&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  pOVar2 = local_18;
  local_1e8 = pOVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"--long1",&local_271);
  local_249 = CLI::Option::check_name(pOVar2,&local_270);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_248,&local_249,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_248,
               (AssertionResult *)"long1->check_name(\"--long1\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xd5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  pOVar2 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2e0,"--lonG1",&local_2e1);
  bVar1 = CLI::Option::check_name(pOVar2,&local_2e0);
  local_2b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_2b8,
               (AssertionResult *)"long1->check_name(\"--lonG1\")","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xd6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  pOVar2 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_350,"--Long2",&local_351);
  local_329 = CLI::Option::check_name(pOVar2,&local_350);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_328,&local_329,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_328,
               (AssertionResult *)"long2->check_name(\"--Long2\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xd8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  pOVar2 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c0,"--long2",&local_3c1);
  bVar1 = CLI::Option::check_name(pOVar2,&local_3c0);
  local_399 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_398,&local_399,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_398,
               (AssertionResult *)"long2->check_name(\"--long2\")","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xd9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_3d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  pOVar2 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"-a",&local_431);
  local_409 = CLI::Option::check_name(pOVar2,&local_430);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_408,&local_409,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_408,
               (AssertionResult *)"short1->check_name(\"-a\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xdb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  pOVar2 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a0,"-A",&local_4a1);
  bVar1 = CLI::Option::check_name(pOVar2,&local_4a0);
  local_479 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar1) {
    testing::Message::Message(&local_4b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_478,
               (AssertionResult *)"short1->check_name(\"-A\")","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xdc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  pOVar2 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,"-B",&local_511);
  local_4e9 = CLI::Option::check_name(pOVar2,&local_510);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_4e8,
               (AssertionResult *)"short2->check_name(\"-B\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xde,pcVar4);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  pOVar2 = local_130;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_580,"-b",&local_581);
  bVar1 = CLI::Option::check_name(pOVar2,&local_580);
  local_559 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_558,&local_559,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar1) {
    testing::Message::Message(&local_590);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_558,
               (AssertionResult *)"short2->check_name(\"-b\")","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_598,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xdf,pcVar4);
    testing::internal::AssertHelper::operator=(&local_598,&local_590);
    testing::internal::AssertHelper::~AssertHelper(&local_598);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_590);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  pOVar2 = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5f0,"pos1",&local_5f1);
  local_5c9 = CLI::Option::check_name(pOVar2,&local_5f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5c8,&local_5c9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c8);
  if (!bVar1) {
    testing::Message::Message(&local_600);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_5c8,
               (AssertionResult *)"pos1->check_name(\"pos1\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_608,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xe1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_608,&local_600);
    testing::internal::AssertHelper::~AssertHelper(&local_608);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c8);
  pOVar2 = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_660,"poS1",&local_661);
  bVar1 = CLI::Option::check_name(pOVar2,&local_660);
  local_639 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_638,&local_639,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_638,
               (AssertionResult *)"pos1->check_name(\"poS1\")","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xe2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_678,&local_670);
    testing::internal::AssertHelper::~AssertHelper(&local_678);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_670);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  pOVar2 = local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6d0,"pOs2",&local_6d1);
  local_6a9 = CLI::Option::check_name(pOVar2,&local_6d0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6a8,&local_6a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a8);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_6a8,
               (AssertionResult *)"pos2->check_name(\"pOs2\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xe4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper(&local_6e8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a8);
  pOVar2 = local_1e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_740,"pos2",&local_741);
  bVar1 = CLI::Option::check_name(pOVar2,&local_740);
  local_719 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_718,&local_719,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar1) {
    testing::Message::Message(&local_750);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_778,(internal *)local_718,(AssertionResult *)"pos2->check_name(\"pos2\")",
               "true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_758,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0xe5,pcVar4);
    testing::internal::AssertHelper::operator=(&local_758,&local_750);
    testing::internal::AssertHelper::~AssertHelper(&local_758);
    std::__cxx11::string::~string((string *)&local_778);
    testing::Message::~Message(&local_750);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  return;
}

Assistant:

TEST_F(TApp, CheckName) {
    auto long1 = app.add_flag("--long1");
    auto long2 = app.add_flag("--Long2");
    auto short1 = app.add_flag("-a");
    auto short2 = app.add_flag("-B");
    int x, y;
    auto pos1 = app.add_option("pos1", x);
    auto pos2 = app.add_option("pOs2", y);

    EXPECT_TRUE(long1->check_name("--long1"));
    EXPECT_FALSE(long1->check_name("--lonG1"));

    EXPECT_TRUE(long2->check_name("--Long2"));
    EXPECT_FALSE(long2->check_name("--long2"));

    EXPECT_TRUE(short1->check_name("-a"));
    EXPECT_FALSE(short1->check_name("-A"));

    EXPECT_TRUE(short2->check_name("-B"));
    EXPECT_FALSE(short2->check_name("-b"));

    EXPECT_TRUE(pos1->check_name("pos1"));
    EXPECT_FALSE(pos1->check_name("poS1"));

    EXPECT_TRUE(pos2->check_name("pOs2"));
    EXPECT_FALSE(pos2->check_name("pos2"));
}